

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua_cjson.c
# Opt level: O3

void json_append_string(lua_State *l,strbuf_t *json,int lindex)

{
  byte bVar1;
  uint uVar2;
  ulong in_RAX;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  size_t len;
  ulong local_28;
  
  local_28 = in_RAX;
  pcVar3 = lua_tolstring(l,lindex,&local_28);
  iVar4 = (int)local_28 * 6 + 2;
  uVar2 = json->length;
  if ((int)(~uVar2 + json->size) < iVar4) {
    strbuf_resize(json,iVar4 + uVar2);
    uVar2 = json->length;
  }
  json->length = uVar2 + 1;
  json->buf[(int)uVar2] = '\"';
  if (local_28 != 0) {
    uVar5 = 0;
    do {
      bVar1 = pcVar3[uVar5];
      if (char2escape[bVar1] == (char *)0x0) {
        iVar4 = json->length;
        json->length = iVar4 + 1;
        json->buf[iVar4] = bVar1;
      }
      else {
        strbuf_append_string(json,char2escape[bVar1]);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < local_28);
  }
  iVar4 = json->length;
  json->length = iVar4 + 1;
  json->buf[iVar4] = '\"';
  return;
}

Assistant:

static void json_append_string(lua_State *l, strbuf_t *json, int lindex)
{
    const char *escstr;
    const char *str;
    size_t len;
    size_t i;

    str = lua_tolstring(l, lindex, &len);

    /* Worst case is len * 6 (all unicode escapes).
     * This buffer is reused constantly for small strings
     * If there are any excess pages, they won't be hit anyway.
     * This gains ~5% speedup. */
    strbuf_ensure_empty_length(json, len * 6 + 2);

    strbuf_append_char_unsafe(json, '\"');
    for (i = 0; i < len; i++) {
        escstr = char2escape[(unsigned char)str[i]];
        if (escstr)
            strbuf_append_string(json, escstr);
        else
            strbuf_append_char_unsafe(json, str[i]);
    }
    strbuf_append_char_unsafe(json, '\"');
}